

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  pointer pBVar1;
  pointer pBVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  pointer pBVar5;
  pointer pBVar6;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char *__s;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  cmLinkImplementationLibraries *pcVar12;
  string *item;
  cmGeneratorTarget *str1;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arg;
  cmStringRange cVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end2;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkObjectsEntries;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceSourcesEntries;
  TargetPropertyEntry *local_188;
  string uniqueName;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_160;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  cmGeneratorExpressionDAGChecker dagChecker;
  string genex;
  string local_70;
  cmGeneratorExpression ge;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
      cVar14 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
      while (__end2 = cVar14.End._M_current, arg = cVar14.Begin._M_current,
            arg._M_current != __end2._M_current) {
        dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
        dagChecker.Target = (cmGeneratorTarget *)0x0;
        dagChecker.Property._M_dataplus._M_p = (pointer)0x0;
        cmSystemTools::ExpandListArgument
                  (arg._M_current,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker,false);
        pcVar4 = dagChecker.Target;
        for (str1 = (cmGeneratorTarget *)dagChecker.Parent; str1 != pcVar4;
            str1 = (cmGeneratorTarget *)&str1->ObjectDirectory) {
          bVar10 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str1,(char (*) [18])"$<TARGET_OBJECTS:");
          if ((!bVar10) ||
             ((((_Alloc_hider *)&str1->Target)->_M_p + -1)[(long)str1->Makefile] != '>')) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker);
        cVar14.End._M_current = __end2._M_current;
        cVar14.Begin._M_current = arg._M_current + 1;
      }
    }
    else {
      debugProperties.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      debugProperties.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      debugProperties.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dagChecker,"CMAKE_DEBUG_TARGET_PROPERTIES",
                 (allocator<char> *)&uniqueSrcs);
      __s = cmMakefile::GetDefinition(this_00,(string *)&dagChecker);
      std::__cxx11::string::~string((string *)&dagChecker);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dagChecker,__s,(allocator<char> *)&uniqueSrcs);
        cmSystemTools::ExpandListArgument((string *)&dagChecker,&debugProperties,false);
        std::__cxx11::string::~string((string *)&dagChecker);
      }
      if (this->DebugSourcesDone == false) {
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                           (debugProperties.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            debugProperties.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,"SOURCES");
        bVar10 = _Var11._M_current !=
                 debugProperties.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        bVar10 = false;
      }
      if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
        this->DebugSourcesDone = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"SOURCES",(allocator<char> *)&uniqueSrcs);
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                (&dagChecker,this,&local_70,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      std::__cxx11::string::~string((string *)&local_70);
      uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
      uniqueSrcs._M_h._M_bucket_count = 1;
      uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uniqueSrcs._M_h._M_element_count = 0;
      uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
      uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
      bVar8 = processSources(this,&this->SourceEntries,__return_storage_ptr__,&uniqueSrcs,
                             &dagChecker,config,bVar10);
      linkInterfaceSourcesEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkInterfaceSourcesEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      linkInterfaceSourcesEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uniqueName,"INTERFACE_SOURCES",(allocator<char> *)&genex);
      AddInterfaceEntries(this,config,&uniqueName,&linkInterfaceSourcesEntries);
      std::__cxx11::string::~string((string *)&uniqueName);
      pBVar1 = (__return_storage_ptr__->
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pBVar2 = (__return_storage_ptr__->
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar9 = processSources(this,&linkInterfaceSourcesEntries,__return_storage_ptr__,&uniqueSrcs,
                             &dagChecker,config,bVar10);
      linkObjectsEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkObjectsEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      linkObjectsEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar12 = GetLinkImplementationLibraries(this,config);
      if (pcVar12 != (cmLinkImplementationLibraries *)0x0) {
        pcVar3 = (pcVar12->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        p_Var13 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                  &(((pcVar12->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_cmLinkItem).Backtrace;
        while( true ) {
          if ((pointer)&p_Var13[-3]._M_refcount == pcVar3) break;
          pcVar4 = (cmGeneratorTarget *)p_Var13[-1]._M_refcount._M_pi;
          if ((pcVar4 != (cmGeneratorTarget *)0x0) &&
             (pcVar4->Target->TargetTypeValue == OBJECT_LIBRARY)) {
            cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                      (&uniqueName,this->LocalGenerator->GlobalGenerator,pcVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge,
                           "$<TARGET_OBJECTS:",&uniqueName);
            std::operator+(&genex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ge,">");
            std::__cxx11::string::~string((string *)&ge);
            std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_160,p_Var13);
            cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_160);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount)
            ;
            cmGeneratorExpression::Parse
                      ((cmGeneratorExpression *)&cge,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
            uVar7 = cge;
            *(undefined1 *)
             ((long)cge._M_t.
                    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
             0x168) = 1;
            local_188 = (TargetPropertyEntry *)operator_new(0x28);
            cge._M_t.
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                  )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    )0x0;
            local_188->LinkImplItem = (cmLinkImplItem *)&p_Var13[-3]._M_refcount;
            (local_188->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            (local_188->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_188->_vptr_TargetPropertyEntry =
                 (_func_int **)&PTR__TargetPropertyEntryGenex_005393c8;
            local_188[1]._vptr_TargetPropertyEntry =
                 (_func_int **)
                 uVar7._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
            local_200._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
                 (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                  )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                    )0x0;
            std::
            vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
            ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                      ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                        *)&linkObjectsEntries,&local_188);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&local_200);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&cge);
            cmGeneratorExpression::~cmGeneratorExpression(&ge);
            std::__cxx11::string::~string((string *)&genex);
            std::__cxx11::string::~string((string *)&uniqueName);
          }
          p_Var13 = p_Var13 + 4;
        }
      }
      pBVar5 = (__return_storage_ptr__->
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pBVar6 = (__return_storage_ptr__->
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar10 = processSources(this,&linkObjectsEntries,__return_storage_ptr__,&uniqueSrcs,
                              &dagChecker,config,bVar10);
      if (((!bVar8) &&
          ((!bVar9 ||
           ((ulong)((long)(__return_storage_ptr__->
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) <=
            (ulong)((long)pBVar1 - (long)pBVar2))))) &&
         ((!bVar10 ||
          ((ulong)((long)(__return_storage_ptr__->
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) <=
           (ulong)((long)pBVar5 - (long)pBVar6))))) {
        this->LinkImplementationLanguageIsContextDependent = false;
      }
      cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
                (&linkInterfaceSourcesEntries);
      cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
                (&linkObjectsEntries);
      std::
      _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ::~_Vector_base(&linkObjectsEntries.
                       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                     );
      std::
      _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ::~_Vector_base(&linkInterfaceSourcesEntries.
                       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                     );
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniqueSrcs._M_h);
      cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugProperties);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x42c,
                "std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(const std::string &) const"
               );
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmStringRange sourceEntries = this->Target->GetSourceEntries();
    for (std::string const& entry : sourceEntries) {
      std::vector<std::string> items;
      cmSystemTools::ExpandListArgument(entry, items);
      for (std::string const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugSources = !this->DebugSourcesDone &&
    std::find(debugProperties.begin(), debugProperties.end(), "SOURCES") !=
      debugProperties.end();

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, this->SourceEntries, files, uniqueSrcs, &dagChecker,
                   config, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES",
                      linkInterfaceSourcesEntries);
  std::vector<std::string>::size_type numFilesBefore = files.size();
  bool contextDependentInterfaceSources =
    processSources(this, linkInterfaceSourcesEntries, files, uniqueSrcs,
                   &dagChecker, config, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  std::vector<cmGeneratorTarget::TargetPropertyEntry*> linkObjectsEntries;
  AddObjectEntries(this, config, linkObjectsEntries);
  std::vector<std::string>::size_type numFilesBefore2 = files.size();
  bool contextDependentObjects =
    processSources(this, linkObjectsEntries, files, uniqueSrcs, &dagChecker,
                   config, debugSources);

  if (!contextDependentDirectSources &&
      !(contextDependentInterfaceSources && numFilesBefore < files.size()) &&
      !(contextDependentObjects && numFilesBefore2 < files.size())) {
    this->LinkImplementationLanguageIsContextDependent = false;
  }

  cmDeleteAll(linkInterfaceSourcesEntries);
  cmDeleteAll(linkObjectsEntries);
  return files;
}